

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O1

int dwarf_get_LANG_name(uint val,char **s_out)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  if ((int)val < 0x8000) {
    switch(val) {
    case 1:
      pcVar2 = "DW_LANG_C89";
      break;
    case 2:
      pcVar2 = "DW_LANG_C";
      break;
    case 3:
      pcVar2 = "DW_LANG_Ada83";
      break;
    case 4:
      pcVar2 = "DW_LANG_C_plus_plus";
      break;
    case 5:
      pcVar2 = "DW_LANG_Cobol74";
      break;
    case 6:
      pcVar2 = "DW_LANG_Cobol85";
      break;
    case 7:
      pcVar2 = "DW_LANG_Fortran77";
      break;
    case 8:
      pcVar2 = "DW_LANG_Fortran90";
      break;
    case 9:
      pcVar2 = "DW_LANG_Pascal83";
      break;
    case 10:
      pcVar2 = "DW_LANG_Modula2";
      break;
    case 0xb:
      pcVar2 = "DW_LANG_Java";
      break;
    case 0xc:
      pcVar2 = "DW_LANG_C99";
      break;
    case 0xd:
      pcVar2 = "DW_LANG_Ada95";
      break;
    case 0xe:
      pcVar2 = "DW_LANG_Fortran95";
      break;
    case 0xf:
      pcVar2 = "DW_LANG_PLI";
      break;
    case 0x10:
      pcVar2 = "DW_LANG_ObjC";
      break;
    case 0x11:
      pcVar2 = "DW_LANG_ObjC_plus_plus";
      break;
    case 0x12:
      pcVar2 = "DW_LANG_UPC";
      break;
    case 0x13:
      pcVar2 = "DW_LANG_D";
      break;
    case 0x14:
      pcVar2 = "DW_LANG_Python";
      break;
    case 0x15:
      pcVar2 = "DW_LANG_OpenCL";
      break;
    case 0x16:
      pcVar2 = "DW_LANG_Go";
      break;
    case 0x17:
      pcVar2 = "DW_LANG_Modula3";
      break;
    case 0x18:
      pcVar2 = "DW_LANG_Haskel";
      break;
    case 0x19:
      pcVar2 = "DW_LANG_C_plus_plus_03";
      break;
    case 0x1a:
      pcVar2 = "DW_LANG_C_plus_plus_11";
      break;
    case 0x1b:
      pcVar2 = "DW_LANG_OCaml";
      break;
    case 0x1c:
      pcVar2 = "DW_LANG_Rust";
      break;
    case 0x1d:
      pcVar2 = "DW_LANG_C11";
      break;
    case 0x1e:
      pcVar2 = "DW_LANG_Swift";
      break;
    case 0x1f:
      pcVar2 = "DW_LANG_Julia";
      break;
    case 0x20:
      pcVar2 = "DW_LANG_Dylan";
      break;
    case 0x21:
      pcVar2 = "DW_LANG_C_plus_plus_14";
      break;
    case 0x22:
      pcVar2 = "DW_LANG_Fortran03";
      break;
    case 0x23:
      pcVar2 = "DW_LANG_Fortran08";
      break;
    case 0x24:
      pcVar2 = "DW_LANG_RenderScript";
      break;
    case 0x25:
      pcVar2 = "DW_LANG_BLISS";
      break;
    case 0x26:
      pcVar2 = "DW_LANG_Kotlin";
      break;
    case 0x27:
      pcVar2 = "DW_LANG_Zig";
      break;
    case 0x28:
      pcVar2 = "DW_LANG_Crystal";
      break;
    default:
      goto switchD_001c0826_caseD_29;
    case 0x2a:
      pcVar2 = "DW_LANG_C_plus_plus_17";
      break;
    case 0x2b:
      pcVar2 = "DW_LANG_C_plus_plus_20";
      break;
    case 0x2c:
      pcVar2 = "DW_LANG_C17";
      break;
    case 0x2d:
      pcVar2 = "DW_LANG_Fortran18";
      break;
    case 0x2e:
      pcVar2 = "DW_LANG_Ada2005";
      break;
    case 0x2f:
      pcVar2 = "DW_LANG_Ada2012";
      break;
    case 0x30:
      pcVar2 = "DW_LANG_HIP";
      break;
    case 0x31:
      pcVar2 = "DW_LANG_Assembly";
      break;
    case 0x32:
      pcVar2 = "DW_LANG_C_sharp";
      break;
    case 0x33:
      pcVar2 = "DW_LANG_Mojo";
      break;
    case 0x34:
      pcVar2 = "DW_LANG_GLSL";
      break;
    case 0x35:
      pcVar2 = "DW_LANG_GLSL_ES";
      break;
    case 0x36:
      pcVar2 = "DW_LANG_HLSL";
      break;
    case 0x37:
      pcVar2 = "DW_LANG_OpenCL_CPP";
      break;
    case 0x38:
      pcVar2 = "DW_LANG_CPP_for_OpenCL";
      break;
    case 0x39:
      pcVar2 = "DW_LANG_SYCL";
      break;
    case 0x40:
      pcVar2 = "DW_LANG_Ruby";
      break;
    case 0x41:
      pcVar2 = "DW_LANG_Move";
      break;
    case 0x42:
      pcVar2 = "DW_LANG_Hylo";
    }
  }
  else if ((int)val < 0x9001) {
    if ((int)val < 0x8765) {
      if (val == 0x8000) {
        pcVar2 = "DW_LANG_lo_user";
      }
      else {
        if (val != 0x8001) {
          return -1;
        }
        pcVar2 = "DW_LANG_Mips_Assembler";
      }
    }
    else if (val == 0x8765) {
      pcVar2 = "DW_LANG_Upc";
    }
    else {
      if (val != 0x8e57) {
        return -1;
      }
      pcVar2 = "DW_LANG_GOOGLE_RenderScript";
    }
  }
  else if ((int)val < 0xb000) {
    if (val == 0x9001) {
      pcVar2 = "DW_LANG_SUN_Assembler";
    }
    else {
      if (val != 0x9101) {
        return -1;
      }
      pcVar2 = "DW_LANG_ALTIUM_Assembler";
    }
  }
  else if (val == 0xb000) {
    pcVar2 = "DW_LANG_BORLAND_Delphi";
  }
  else {
    if (val != 0xffff) {
      return -1;
    }
    pcVar2 = "DW_LANG_hi_user";
  }
  *s_out = pcVar2;
  iVar1 = 0;
switchD_001c0826_caseD_29:
  return iVar1;
}

Assistant:

int
dwarf_get_LANG_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_LANG_C89:
        *s_out = "DW_LANG_C89";
        return DW_DLV_OK;
    case DW_LANG_C:
        *s_out = "DW_LANG_C";
        return DW_DLV_OK;
    case DW_LANG_Ada83:
        *s_out = "DW_LANG_Ada83";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus:
        *s_out = "DW_LANG_C_plus_plus";
        return DW_DLV_OK;
    case DW_LANG_Cobol74:
        *s_out = "DW_LANG_Cobol74";
        return DW_DLV_OK;
    case DW_LANG_Cobol85:
        *s_out = "DW_LANG_Cobol85";
        return DW_DLV_OK;
    case DW_LANG_Fortran77:
        *s_out = "DW_LANG_Fortran77";
        return DW_DLV_OK;
    case DW_LANG_Fortran90:
        *s_out = "DW_LANG_Fortran90";
        return DW_DLV_OK;
    case DW_LANG_Pascal83:
        *s_out = "DW_LANG_Pascal83";
        return DW_DLV_OK;
    case DW_LANG_Modula2:
        *s_out = "DW_LANG_Modula2";
        return DW_DLV_OK;
    case DW_LANG_Java:
        *s_out = "DW_LANG_Java";
        return DW_DLV_OK;
    case DW_LANG_C99:
        *s_out = "DW_LANG_C99";
        return DW_DLV_OK;
    case DW_LANG_Ada95:
        *s_out = "DW_LANG_Ada95";
        return DW_DLV_OK;
    case DW_LANG_Fortran95:
        *s_out = "DW_LANG_Fortran95";
        return DW_DLV_OK;
    case DW_LANG_PLI:
        *s_out = "DW_LANG_PLI";
        return DW_DLV_OK;
    case DW_LANG_ObjC:
        *s_out = "DW_LANG_ObjC";
        return DW_DLV_OK;
    case DW_LANG_ObjC_plus_plus:
        *s_out = "DW_LANG_ObjC_plus_plus";
        return DW_DLV_OK;
    case DW_LANG_UPC:
        *s_out = "DW_LANG_UPC";
        return DW_DLV_OK;
    case DW_LANG_D:
        *s_out = "DW_LANG_D";
        return DW_DLV_OK;
    case DW_LANG_Python:
        *s_out = "DW_LANG_Python";
        return DW_DLV_OK;
    case DW_LANG_OpenCL:
        *s_out = "DW_LANG_OpenCL";
        return DW_DLV_OK;
    case DW_LANG_Go:
        *s_out = "DW_LANG_Go";
        return DW_DLV_OK;
    case DW_LANG_Modula3:
        *s_out = "DW_LANG_Modula3";
        return DW_DLV_OK;
    case DW_LANG_Haskel:
        *s_out = "DW_LANG_Haskel";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_03:
        *s_out = "DW_LANG_C_plus_plus_03";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_11:
        *s_out = "DW_LANG_C_plus_plus_11";
        return DW_DLV_OK;
    case DW_LANG_OCaml:
        *s_out = "DW_LANG_OCaml";
        return DW_DLV_OK;
    case DW_LANG_Rust:
        *s_out = "DW_LANG_Rust";
        return DW_DLV_OK;
    case DW_LANG_C11:
        *s_out = "DW_LANG_C11";
        return DW_DLV_OK;
    case DW_LANG_Swift:
        *s_out = "DW_LANG_Swift";
        return DW_DLV_OK;
    case DW_LANG_Julia:
        *s_out = "DW_LANG_Julia";
        return DW_DLV_OK;
    case DW_LANG_Dylan:
        *s_out = "DW_LANG_Dylan";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_14:
        *s_out = "DW_LANG_C_plus_plus_14";
        return DW_DLV_OK;
    case DW_LANG_Fortran03:
        *s_out = "DW_LANG_Fortran03";
        return DW_DLV_OK;
    case DW_LANG_Fortran08:
        *s_out = "DW_LANG_Fortran08";
        return DW_DLV_OK;
    case DW_LANG_RenderScript:
        *s_out = "DW_LANG_RenderScript";
        return DW_DLV_OK;
    case DW_LANG_BLISS:
        *s_out = "DW_LANG_BLISS";
        return DW_DLV_OK;
    case DW_LANG_Kotlin:
        *s_out = "DW_LANG_Kotlin";
        return DW_DLV_OK;
    case DW_LANG_Zig:
        *s_out = "DW_LANG_Zig";
        return DW_DLV_OK;
    case DW_LANG_Crystal:
        *s_out = "DW_LANG_Crystal";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_17:
        *s_out = "DW_LANG_C_plus_plus_17";
        return DW_DLV_OK;
    case DW_LANG_C_plus_plus_20:
        *s_out = "DW_LANG_C_plus_plus_20";
        return DW_DLV_OK;
    case DW_LANG_C17:
        *s_out = "DW_LANG_C17";
        return DW_DLV_OK;
    case DW_LANG_Fortran18:
        *s_out = "DW_LANG_Fortran18";
        return DW_DLV_OK;
    case DW_LANG_Ada2005:
        *s_out = "DW_LANG_Ada2005";
        return DW_DLV_OK;
    case DW_LANG_Ada2012:
        *s_out = "DW_LANG_Ada2012";
        return DW_DLV_OK;
    case DW_LANG_HIP:
        *s_out = "DW_LANG_HIP";
        return DW_DLV_OK;
    case DW_LANG_Assembly:
        *s_out = "DW_LANG_Assembly";
        return DW_DLV_OK;
    case DW_LANG_C_sharp:
        *s_out = "DW_LANG_C_sharp";
        return DW_DLV_OK;
    case DW_LANG_Mojo:
        *s_out = "DW_LANG_Mojo";
        return DW_DLV_OK;
    case DW_LANG_GLSL:
        *s_out = "DW_LANG_GLSL";
        return DW_DLV_OK;
    case DW_LANG_GLSL_ES:
        *s_out = "DW_LANG_GLSL_ES";
        return DW_DLV_OK;
    case DW_LANG_HLSL:
        *s_out = "DW_LANG_HLSL";
        return DW_DLV_OK;
    case DW_LANG_OpenCL_CPP:
        *s_out = "DW_LANG_OpenCL_CPP";
        return DW_DLV_OK;
    case DW_LANG_CPP_for_OpenCL:
        *s_out = "DW_LANG_CPP_for_OpenCL";
        return DW_DLV_OK;
    case DW_LANG_SYCL:
        *s_out = "DW_LANG_SYCL";
        return DW_DLV_OK;
    case DW_LANG_Ruby:
        *s_out = "DW_LANG_Ruby";
        return DW_DLV_OK;
    case DW_LANG_Move:
        *s_out = "DW_LANG_Move";
        return DW_DLV_OK;
    case DW_LANG_Hylo:
        *s_out = "DW_LANG_Hylo";
        return DW_DLV_OK;
    case DW_LANG_lo_user:
        *s_out = "DW_LANG_lo_user";
        return DW_DLV_OK;
    case DW_LANG_Mips_Assembler:
        *s_out = "DW_LANG_Mips_Assembler";
        return DW_DLV_OK;
    case DW_LANG_Upc:
        *s_out = "DW_LANG_Upc";
        return DW_DLV_OK;
    case DW_LANG_GOOGLE_RenderScript:
        *s_out = "DW_LANG_GOOGLE_RenderScript";
        return DW_DLV_OK;
    case DW_LANG_SUN_Assembler:
        *s_out = "DW_LANG_SUN_Assembler";
        return DW_DLV_OK;
    case DW_LANG_ALTIUM_Assembler:
        *s_out = "DW_LANG_ALTIUM_Assembler";
        return DW_DLV_OK;
    case DW_LANG_BORLAND_Delphi:
        *s_out = "DW_LANG_BORLAND_Delphi";
        return DW_DLV_OK;
    case DW_LANG_hi_user:
        *s_out = "DW_LANG_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}